

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

LocalNameInfo * __thiscall
luna::CodeGenerateVisitor::SearchFunctionLocalName
          (CodeGenerateVisitor *this,GenerateFunction *function,String *name)

{
  iterator iVar1;
  GenerateBlock *pGVar2;
  String *local_20;
  
  pGVar2 = (GenerateBlock *)&function->current_block_;
  local_20 = name;
  do {
    pGVar2 = pGVar2->parent_;
    if (pGVar2 == (GenerateBlock *)0x0) {
      return (LocalNameInfo *)0x0;
    }
    iVar1 = std::
            _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(pGVar2->names_)._M_h,&local_20);
  } while (iVar1.
           super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>.
           _M_cur == (__node_type *)0x0);
  return (LocalNameInfo *)
         ((long)iVar1.
                super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                ._M_cur + 0x10);
}

Assistant:

const LocalNameInfo * SearchFunctionLocalName(GenerateFunction *function,
                                                      String *name) const
        {
            auto block = function->current_block_;
            while (block)
            {
                auto it = block->names_.find(name);
                if (it != block->names_.end())
                    return &it->second;
                else
                    block = block->parent_;
            }

            return nullptr;
        }